

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

bool __thiscall QDecompressHelper::countInternal(QDecompressHelper *this,QByteDataBuffer *buffer)

{
  _Head_base<0UL,_QDecompressHelper_*,_false> __p;
  bool bVar1;
  qint64 qVar2;
  QDecompressHelper *pQVar3;
  long in_FS_OFFSET;
  _Head_base<0UL,_QDecompressHelper_*,_false> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  if (this->countDecompressed == true) {
    pQVar3 = (this->countHelper)._M_t.
             super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>._M_t.
             super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
             super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
    if (pQVar3 == (QDecompressHelper *)0x0) {
      std::make_unique<QDecompressHelper>();
      __p._M_head_impl = local_30._M_head_impl;
      local_30._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::reset
                ((__uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)
                 &this->countHelper,__p._M_head_impl);
      std::unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_>::~unique_ptr
                ((unique_ptr<QDecompressHelper,_std::default_delete<QDecompressHelper>_> *)&local_30
                );
      pQVar3 = (this->countHelper)._M_t.
               super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
               _M_t.
               super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
               super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
      qVar2 = 0x7fffffffffffffff;
      if (this->archiveBombCheckThreshold != -1) {
        qVar2 = this->archiveBombCheckThreshold;
      }
      pQVar3->archiveBombCheckThreshold = qVar2;
      setEncoding(pQVar3,this->contentEncoding);
      pQVar3 = (this->countHelper)._M_t.
               super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>.
               _M_t.
               super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
               super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
    }
    feed(pQVar3,buffer);
    bVar1 = countInternal(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDecompressHelper::countInternal(const QByteDataBuffer &buffer)
{
    if (countDecompressed) {
        if (!countHelper) {
            countHelper = std::make_unique<QDecompressHelper>();
            countHelper->setDecompressedSafetyCheckThreshold(archiveBombCheckThreshold);
            countHelper->setEncoding(contentEncoding);
        }
        countHelper->feed(buffer);
        return countInternal();
    }
    return true;
}